

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsComponentAddPartSubEntities
              (FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsIntType id_store_type,
              FmsIntType ent_id_type,void *ents,FmsInt num_ents)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  void *__ptr;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  _FmsPart_private *p_Var7;
  
  if (comp == (FmsComponent)0x0) {
    iVar4 = 1;
  }
  else {
    iVar4 = 2;
    if ((((part_id < comp->num_parts) && (iVar4 = 3, type < FMS_NUM_ENTITY_TYPES)) &&
        ((comp->dim == 0x7f || (iVar4 = 4, FmsEntityDim[type] < comp->dim)))) &&
       ((iVar4 = 5, id_store_type < FMS_NUM_INT_TYPES &&
        (iVar4 = 6, ent_id_type < FMS_NUM_INT_TYPES)))) {
      p_Var7 = comp->parts + part_id;
      uVar1 = p_Var7->num_entities[type];
      __ptr = p_Var7->entities_ids[type];
      if (uVar1 == 0) {
        if ((ents == (void *)0x0) && (p_Var7->domain->num_entities[type] != num_ents)) {
          return 10;
        }
      }
      else {
        if (__ptr == (void *)0x0) {
          return 7;
        }
        if (ents == (void *)0x0) {
          return 8;
        }
        if (p_Var7->entities_ids_type[type] != id_store_type) {
          return 9;
        }
      }
      uVar6 = uVar1;
      if (num_ents != 0) {
        sVar2 = FmsIntTypeSize[id_store_type];
        uVar6 = uVar1 + num_ents;
        uVar3 = 1;
        do {
          uVar5 = uVar3;
          uVar3 = uVar5 * 2;
        } while (uVar5 < uVar6);
        if (ents != (void *)0x0) {
          if (uVar1 <= uVar5 >> 1) {
            __ptr = realloc(__ptr,uVar5 * sVar2);
            if (__ptr == (void *)0x0) {
              return 0xb;
            }
            p_Var7->entities_ids[type] = __ptr;
          }
          FmsIntConvertCopy(ent_id_type,ents,id_store_type,(void *)(sVar2 * uVar1 + (long)__ptr),
                            num_ents);
        }
      }
      p_Var7->num_entities[type] = uVar6;
      iVar4 = 0;
      if (uVar1 == 0) {
        p_Var7->entities_ids_type[type] = id_store_type;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int FmsComponentAddPartSubEntities(FmsComponent comp, FmsInt part_id,
                                   FmsEntityType type, FmsIntType id_store_type,
                                   FmsIntType ent_id_type, const void *ents,
                                   FmsInt num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  if (comp->dim != FMS_INVALID_DIM && comp->dim <= FmsEntityDim[type]) {
    E_RETURN(4);
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(5); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(6); }
  struct _FmsPart_private *part = comp->parts + part_id;
  const FmsInt num_entities = part->num_entities[type];
  void *entities_ids = part->entities_ids[type];
  if (num_entities != 0) {
    if (entities_ids == NULL) { E_RETURN(7); }
    if (ents == NULL) { E_RETURN(8); }
    if (part->entities_ids_type[type] != id_store_type) { E_RETURN(9); }
  } else if (ents == NULL) {
    if (num_ents != part->domain->num_entities[type]) { E_RETURN(10); }
  }
  const size_t sizeof_ent_ids = FmsIntTypeSize[id_store_type];
  if (num_ents != 0) {
    const FmsInt nc = NextPow2(num_entities + num_ents);
    if (ents != NULL) {
      if (num_entities <= nc/2) {
        entities_ids = realloc(entities_ids, nc*sizeof_ent_ids);
        if (entities_ids == NULL) { E_RETURN(11); }
        part->entities_ids[type] = entities_ids;
      }
      FmsIntConvertCopy(ent_id_type, ents, id_store_type,
                        (char*)entities_ids + num_entities*sizeof_ent_ids,
                        num_ents);
    } else {
      // part->entities_ids[type] is already NULL since num_entities is 0
    }
  }
  // Update the part
  part->num_entities[type] = num_entities + num_ents;
  if (num_entities == 0) {
    part->entities_ids_type[type] = id_store_type;
  }
  // Nothing to update in the component
  return 0;
}